

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O2

void store_number(char *dest,uint number)

{
  int iVar1;
  size_t sVar2;
  uint uVar3;
  
  sVar2 = strlen(dest);
  iVar1 = num_length(number);
  uVar3 = iVar1 + (int)sVar2;
  dest[uVar3] = '\0';
  if (number == 0) {
    dest[uVar3 - 1] = '0';
    uVar3 = uVar3 - 2;
  }
  else {
    uVar3 = iVar1 + (int)sVar2;
    while( true ) {
      uVar3 = uVar3 - 1;
      if (number == 0) break;
      dest[uVar3] = (byte)(number % 10) | 0x30;
      number = number / 10;
    }
  }
  dest[uVar3] = '_';
  return;
}

Assistant:

void
store_number(char *dest, unsigned number)
{
  unsigned i = strlen(dest) + num_length(number);
  dest[i] = '\0';
  if (number) {
    --i;
    while (number > 0) {
      unsigned digit = number % 10;
      dest[i] = '0' + digit;
      number /= 10;
      --i;
    }
  } else {
    dest[i - 1] = '0';
    i -= 2;
  }
  dest[i] = '_';
}